

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void output(string *outputFile)

{
  uint __val;
  FILE *__s;
  undefined8 *puVar1;
  size_t __size;
  uint uVar2;
  long *plVar3;
  ulong uVar4;
  uint uVar5;
  uint __len;
  long *__s_00;
  int *piVar6;
  long lVar7;
  string __str;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  undefined8 local_48;
  long local_40;
  undefined8 uStack_38;
  
  __s = fopen((outputFile->_M_dataplus)._M_p,"w");
  __val = -ansNum;
  if (0 < ansNum) {
    __val = ansNum;
  }
  __len = 1;
  if (9 < __val) {
    uVar4 = (ulong)__val;
    uVar5 = 4;
    do {
      __len = uVar5;
      uVar2 = (uint)uVar4;
      if (uVar2 < 100) {
        __len = __len - 2;
        goto LAB_00102dcd;
      }
      if (uVar2 < 1000) {
        __len = __len - 1;
        goto LAB_00102dcd;
      }
      if (uVar2 < 10000) goto LAB_00102dcd;
      uVar4 = uVar4 / 10000;
      uVar5 = __len + 4;
    } while (99999 < uVar2);
    __len = __len + 1;
  }
LAB_00102dcd:
  uVar5 = (uint)ansNum >> 0x1f;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct((ulong)local_70,(char)__len - (char)(ansNum >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_70[0] + (ulong)uVar5),__len,__val);
  puVar1 = (undefined8 *)std::__cxx11::string::append((char *)local_70);
  __s_00 = (long *)*puVar1;
  plVar3 = puVar1 + 2;
  if (__s_00 == plVar3) {
    local_40 = *plVar3;
    uStack_38 = puVar1[3];
    local_48 = puVar1[1];
    puVar1[1] = 0;
    *(undefined1 *)(puVar1 + 2) = 0;
    __s_00 = &local_40;
    local_50 = &local_40;
  }
  else {
    local_40 = puVar1[2];
    local_48 = puVar1[1];
    *puVar1 = plVar3;
    puVar1[1] = 0;
    *(undefined1 *)(puVar1 + 2) = 0;
    local_50 = __s_00;
    if (__s_00 != &local_40) {
      operator_delete(__s_00,local_40 + 1);
    }
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  __size = strlen((char *)__s_00);
  fwrite(__s_00,__size,1,__s);
  piVar6 = cycleNum + 3;
  lVar7 = 0;
  do {
    fwrite(*(void **)((long)cycle + lVar7),(long)*piVar6,1,__s);
    lVar7 = lVar7 + 8;
    piVar6 = piVar6 + 1;
  } while (lVar7 != 0x28);
  fclose(__s);
  return;
}

Assistant:

void run() {
    int path[16];
    for (int i = 0; i < nodeNum; ++i) {
        if (outDegrees[i] < 1 || inDegrees[i] < 1)continue;
        dfs_range1(i, i, 1);
        dfs_range2(i, i, 1);
        dfs(i, i, 1, path);
    }
}